

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eeep_fruinfo.c
# Opt level: O3

void IpmiFruBuildProductInfoArea(EeePSystemInfo_t *info)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  int iVar4;
  EeePSystemInfo_t *value;
  char cVar5;
  EeePSystemInfo_t *pEVar6;
  EeePSystemInfo_t *pEVar7;
  uint8_t *puVar8;
  
  product_info_area.area.format_version = '\x01';
  product_info_area.area.language_code = '\x19';
  value = info + 1;
  if (info->Manufacturer == '\0') {
LAB_0010203c:
    product_info_area.area.variable_part[0] = 0xc0;
LAB_00102043:
    puVar8 = product_info_area.pad;
  }
  else {
    cVar5 = info->Manufacturer + 0xff;
    pEVar7 = value;
    if (cVar5 != '\0') {
      do {
        pEVar6 = pEVar7;
        sVar3 = strlen((char *)pEVar6);
        pEVar7 = (EeePSystemInfo_t *)((pEVar6->SDBHdr).CDBHdr.DBlockLength + sVar3);
        cVar5 = cVar5 + -1;
      } while (cVar5 != '\0');
      if (pEVar6 == (EeePSystemInfo_t *)0x0) goto LAB_0010203c;
    }
    sVar3 = strlen((char *)pEVar7);
    iVar1 = (int)sVar3;
    iVar4 = 0x3f;
    if (iVar1 < 0x3f) {
      iVar4 = iVar1;
    }
    iVar2 = 2;
    if (iVar1 != 1) {
      iVar2 = iVar4;
    }
    product_info_area.area.variable_part[0] = (char)iVar2 + 0xc0;
    if (iVar2 == 0) goto LAB_00102043;
    memcpy(product_info_area.pad,pEVar7,(long)iVar2);
    puVar8 = product_info_area.pad + iVar2;
  }
  if (info->ProductName == '\0') {
LAB_001020ba:
    *puVar8 = 0xc0;
    puVar8 = puVar8 + 1;
  }
  else {
    cVar5 = info->ProductName + 0xff;
    pEVar7 = value;
    if (cVar5 != '\0') {
      do {
        pEVar6 = pEVar7;
        sVar3 = strlen((char *)pEVar6);
        pEVar7 = (EeePSystemInfo_t *)((pEVar6->SDBHdr).CDBHdr.DBlockLength + sVar3);
        cVar5 = cVar5 + -1;
      } while (cVar5 != '\0');
      if (pEVar6 == (EeePSystemInfo_t *)0x0) goto LAB_001020ba;
    }
    sVar3 = strlen((char *)pEVar7);
    iVar1 = (int)sVar3;
    iVar4 = 0x3f;
    if (iVar1 < 0x3f) {
      iVar4 = iVar1;
    }
    iVar2 = 2;
    if (iVar1 != 1) {
      iVar2 = iVar4;
    }
    *puVar8 = (char)iVar2 + 0xc0;
    puVar8 = puVar8 + 1;
    if (iVar2 != 0) {
      memcpy(puVar8,pEVar7,(long)iVar2);
      puVar8 = puVar8 + iVar2;
    }
  }
  *puVar8 = 0xc0;
  if (info->Version == '\0') {
LAB_00102137:
    puVar8[1] = 0xc0;
    puVar8 = puVar8 + 2;
  }
  else {
    cVar5 = info->Version + 0xff;
    pEVar7 = value;
    if (cVar5 != '\0') {
      do {
        pEVar6 = pEVar7;
        sVar3 = strlen((char *)pEVar6);
        pEVar7 = (EeePSystemInfo_t *)((pEVar6->SDBHdr).CDBHdr.DBlockLength + sVar3);
        cVar5 = cVar5 + -1;
      } while (cVar5 != '\0');
      if (pEVar6 == (EeePSystemInfo_t *)0x0) goto LAB_00102137;
    }
    sVar3 = strlen((char *)pEVar7);
    iVar1 = (int)sVar3;
    iVar4 = 0x3f;
    if (iVar1 < 0x3f) {
      iVar4 = iVar1;
    }
    iVar2 = 2;
    if (iVar1 != 1) {
      iVar2 = iVar4;
    }
    puVar8[1] = (char)iVar2 + 0xc0;
    puVar8 = puVar8 + 2;
    if (iVar2 != 0) {
      memcpy(puVar8,pEVar7,(long)iVar2);
      puVar8 = puVar8 + iVar2;
    }
  }
  if (info->SerialNumber == '\0') {
LAB_001021b0:
    *puVar8 = 0xc0;
    puVar8 = puVar8 + 1;
  }
  else {
    cVar5 = info->SerialNumber + 0xff;
    pEVar7 = value;
    if (cVar5 != '\0') {
      do {
        pEVar6 = pEVar7;
        sVar3 = strlen((char *)pEVar6);
        pEVar7 = (EeePSystemInfo_t *)((pEVar6->SDBHdr).CDBHdr.DBlockLength + sVar3);
        cVar5 = cVar5 + -1;
      } while (cVar5 != '\0');
      if (pEVar6 == (EeePSystemInfo_t *)0x0) goto LAB_001021b0;
    }
    sVar3 = strlen((char *)pEVar7);
    iVar1 = (int)sVar3;
    iVar4 = 0x3f;
    if (iVar1 < 0x3f) {
      iVar4 = iVar1;
    }
    iVar2 = 2;
    if (iVar1 != 1) {
      iVar2 = iVar4;
    }
    *puVar8 = (char)iVar2 + 0xc0;
    puVar8 = puVar8 + 1;
    if (iVar2 != 0) {
      memcpy(puVar8,pEVar7,(long)iVar2);
      puVar8 = puVar8 + iVar2;
    }
  }
  if (info->SKU_Number == '\0') {
LAB_00102227:
    *puVar8 = 0xc0;
    puVar8 = puVar8 + 1;
  }
  else {
    cVar5 = info->SKU_Number + 0xff;
    pEVar7 = value;
    if (cVar5 != '\0') {
      do {
        pEVar6 = pEVar7;
        sVar3 = strlen((char *)pEVar6);
        pEVar7 = (EeePSystemInfo_t *)((pEVar6->SDBHdr).CDBHdr.DBlockLength + sVar3);
        cVar5 = cVar5 + -1;
      } while (cVar5 != '\0');
      if (pEVar6 == (EeePSystemInfo_t *)0x0) goto LAB_00102227;
    }
    sVar3 = strlen((char *)pEVar7);
    iVar1 = (int)sVar3;
    iVar4 = 0x3f;
    if (iVar1 < 0x3f) {
      iVar4 = iVar1;
    }
    iVar2 = 2;
    if (iVar1 != 1) {
      iVar2 = iVar4;
    }
    *puVar8 = (char)iVar2 + 0xc0;
    puVar8 = puVar8 + 1;
    if (iVar2 != 0) {
      memcpy(puVar8,pEVar7,(long)iVar2);
      puVar8 = puVar8 + iVar2;
    }
  }
  *puVar8 = 0xc0;
  puVar8 = puVar8 + 1;
  if (info->Family != '\0') {
    cVar5 = info->Family + 0xff;
    if (cVar5 != '\0') {
      do {
        pEVar7 = value;
        sVar3 = strlen((char *)pEVar7);
        value = (EeePSystemInfo_t *)((pEVar7->SDBHdr).CDBHdr.DBlockLength + sVar3);
        cVar5 = cVar5 + -1;
      } while (cVar5 != '\0');
      if (pEVar7 == (EeePSystemInfo_t *)0x0) goto LAB_00102273;
    }
    puVar8 = IpmiFruAddCustomString(puVar8,"FAMILY",(char *)value);
  }
LAB_00102273:
  product_info_area_size = IpmiFruFinalizeArea((uint8_t *)&product_info_area,(int)puVar8 - 0x106164)
  ;
  return;
}

Assistant:

void IpmiFruBuildProductInfoArea(EeePSystemInfo_t *info)
{
    product_info_area.area.format_version = IPMI_FRUINFO_FORMAT_VERSION;
    product_info_area.area.language_code = IPMI_FRUINFO_LANGUAGE_CODE_ENGLISH;
    uint8_t *varp = product_info_area.area.variable_part;

    void *strstart = info + 1;
    const char *str;
    //  Manufacturer
    if (str = GetSmbiosString(info->Manufacturer, strstart)) {
        varp = IpmiFruAddString(varp, str);
    } else {
        *varp++ = 0xC0;
    }
    //  Product name
    if (str = GetSmbiosString(info->ProductName, strstart)) {
        varp = IpmiFruAddString(varp, str);
    } else {
        *varp++ = 0xC0;
    }
    //  Model/Part number - not specified
    *varp++ = 0xC0;
    //  Version
    if (str = GetSmbiosString(info->Version, strstart)) {
        varp = IpmiFruAddString(varp, str);
    } else {
        *varp++ = 0xC0;
    }
    //  Serial number
    if (str = GetSmbiosString(info->SerialNumber, strstart)) {
        varp = IpmiFruAddString(varp, str);
    } else {
        *varp++ = 0xC0;
    }
    //  Asset tag - use SKU number
    if (str = GetSmbiosString(info->SKU_Number, strstart)) {
        varp = IpmiFruAddString(varp, str);
    } else {
        *varp++ = 0xC0;
    }
    //  FRU File ID - not specified
    *varp++ = 0xC0;
    //  Family as custom string
    if (str = GetSmbiosString(info->Family, strstart)) {
        varp = IpmiFruAddCustomString(varp, "FAMILY", str);
    }
    uint8_t *product_area_ptr = (uint8_t *)&product_info_area;
    product_info_area_size = IpmiFruFinalizeArea(product_area_ptr, varp-product_area_ptr);
}